

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  ulong uVar1;
  const_iterator cVar2;
  FieldGenerator *pFVar3;
  undefined7 in_register_00000009;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  int iVar4;
  ulong __n;
  reference rVar5;
  long lStack_160;
  allocator local_151;
  vector<bool,_std::allocator<bool>_> *local_150;
  FieldDescriptor *field;
  undefined4 local_13c;
  FieldGeneratorMap *local_138;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_130;
  Printer *local_128;
  string pod_template;
  string last_field_name;
  string first_field_name;
  string local_c0;
  Formatter format;
  RunMap runs;
  
  local_128 = printer;
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  local_130 = &this->optimized_order_;
  pod_template._M_dataplus._M_p._1_7_ = 0;
  pod_template._M_dataplus._M_p._0_1_ = copy_constructor;
  pod_template.field_2._8_8_ =
       std::
       _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:2947:25)>
       ::_M_invoke;
  pod_template.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:2947:25)>
       ::_M_manager;
  pod_template._M_string_length = (size_type)this;
  anon_unknown_0::FindRuns
            (&runs,local_130,
             (function<bool_(const_google::protobuf::FieldDescriptor_*)> *)&pod_template);
  std::_Function_base::~_Function_base((_Function_base *)&pod_template);
  pod_template._M_dataplus._M_p = (pointer)&pod_template.field_2;
  pod_template._M_string_length = 0;
  pod_template.field_2._M_allocated_capacity =
       pod_template.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::assign((char *)&pod_template);
  local_13c = (undefined4)CONCAT71(in_register_00000009,copy_constructor);
  local_138 = &this->field_generators_;
  local_150 = processed;
  for (iVar4 = 0; __n = (ulong)iVar4,
      __n < (ulong)((long)(this->optimized_order_).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->optimized_order_).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); iVar4 = iVar4 + 1) {
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](processed,__n);
    if ((*rVar5._M_p & rVar5._M_mask) == 0) {
      field = (local_130->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start[__n];
      cVar2 = std::
              _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&runs._M_h,&field);
      if ((cVar2.
           super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
           ._M_cur == (__node_type *)0x0) ||
         (uVar1 = *(ulong *)((long)cVar2.
                                   super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                                   ._M_cur + 0x10), uVar1 < 2)) {
        if ((char)local_13c == '\0') {
          pFVar3 = FieldGeneratorMap::get(local_138,field);
          lStack_160 = 0x78;
        }
        else {
          pFVar3 = FieldGeneratorMap::get(local_138,field);
          lStack_160 = 0x68;
        }
        processed = local_150;
        (**(code **)((long)pFVar3->_vptr_FieldGenerator + lStack_160))(pFVar3,local_128);
      }
      else {
        FieldName_abi_cxx11_(&first_field_name,(cpp *)field,field_00);
        FieldName_abi_cxx11_
                  (&last_field_name,
                   (cpp *)(local_130->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar1 + (__n - 1)],field_01);
        std::__cxx11::string::string((string *)&local_c0,"first",&local_151);
        Formatter::Set<std::__cxx11::string>(&format,&local_c0,&first_field_name);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::string((string *)&local_c0,"last",&local_151);
        Formatter::Set<std::__cxx11::string>(&format,&local_c0,&last_field_name);
        std::__cxx11::string::~string((string *)&local_c0);
        Formatter::operator()<>(&format,pod_template._M_dataplus._M_p);
        iVar4 = iVar4 + (int)uVar1 + -1;
        std::__cxx11::string::~string((string *)&last_field_name);
        std::__cxx11::string::~string((string *)&first_field_name);
        processed = local_150;
      }
    }
  }
  std::__cxx11::string::~string((string *)&pod_template);
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&runs._M_h);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  Formatter format(printer, variables_);

  const RunMap runs = FindRuns(
      optimized_order_, [copy_constructor, this](const FieldDescriptor* field) {
        return (copy_constructor && IsPOD(field)) ||
               (!copy_constructor &&
                CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_));
      });

  std::string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(\n"
        "    reinterpret_cast<char*>(&$first$_) - "
        "reinterpret_cast<char*>(this)),\n"
        "    0, static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "    reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    const auto it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const std::string first_field_name = FieldName(field);
      const std::string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      format.Set("first", first_field_name);
      format.Set("last", last_field_name);

      format(pod_template.c_str());

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}